

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

Mat * ncnn::Mat::from_float16(Mat *__return_storage_ptr__,unsigned_short *data,int size)

{
  int *piVar1;
  Option opt;
  Mat local_a8;
  Option local_60;
  
  local_a8.refcount._0_4_ = 0;
  local_a8.refcount._4_4_ = 0;
  local_a8.elemsize._0_4_ = 2;
  local_a8.elemsize._4_4_ = 0;
  local_a8.elempack = 1;
  local_a8.allocator = (Allocator *)0x0;
  local_a8.w = size;
  local_a8.dims = 1;
  local_a8.h = 1;
  local_a8.d = 1;
  local_a8.c = 1;
  local_a8.cstep = (size_t)size;
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->d = 0;
  __return_storage_ptr__->c = 0;
  local_a8.data = data;
  Option::Option(&local_60);
  local_60.num_threads = 1;
  cast_float16_to_float32(&local_a8,__return_storage_ptr__,&local_60);
  piVar1 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if ((unsigned_short *)local_a8.data != (unsigned_short *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_float16(const unsigned short* data, int size)
{
    Mat src(size, (void*)data, (size_t)2u);
    Mat dst;

    Option opt;
    opt.num_threads = 1; // TODO
    cast_float16_to_float32(src, dst, opt);

    return dst;
}